

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O2

void do_cmd_navigate_down(command *cmd)

{
  loc grid;
  player_upkeep *ppVar1;
  loc start;
  _Bool _Var2;
  wchar_t wVar3;
  loc lVar4;
  square *psVar5;
  monster *mon;
  wchar_t y;
  int y_00;
  wchar_t x;
  int x_00;
  char *fmt;
  int iVar6;
  
  if (player->timed[4] == 0) {
    lVar4.x = (player->grid).x;
    lVar4.y = (player->grid).y;
    _Var2 = square_iswebbed(cave,lVar4);
    if (_Var2) {
      msg("You clear the web.");
      grid.x = (player->grid).x;
      grid.y = (player->grid).y;
      square_destroy_trap(cave,grid);
      player->upkeep->energy_use = (uint)z_info->move_energy;
      return;
    }
    iVar6 = 0;
    for (y_00 = 0; y_00 < cave->height; y_00 = y_00 + 1) {
      for (x_00 = 0; x_00 < cave->width; x_00 = x_00 + 1) {
        lVar4 = (loc)loc(x_00,y_00);
        _Var2 = loc_eq((loc_conflict)lVar4,player->grid);
        if (!_Var2) {
          _Var2 = square_isoccupied(cave,lVar4);
          if (_Var2) {
            psVar5 = square(cave,lVar4);
            mon = cave_monster(cave,(int)psVar5->mon);
            _Var2 = monster_is_obvious(mon);
            if (_Var2) {
              iVar6 = iVar6 + 1;
              break;
            }
          }
        }
      }
    }
    if (iVar6 < 1) {
      ppVar1 = player->upkeep;
      if (ppVar1->steps != (int16_t *)0x0) {
        __assert_fail("!player->upkeep->steps",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-cave.c"
                      ,0x59f,"void do_cmd_navigate_down(struct command *)");
      }
      start.x = (player->grid).x;
      start.y = (player->grid).y;
      wVar3 = path_nearest_known(player,start,square_isdownstairs,(loc *)&ppVar1->path_dest,
                                 &ppVar1->steps);
      ppVar1 = player->upkeep;
      ppVar1->step_count = wVar3;
      if (L'\0' < wVar3) {
        ppVar1->running = wVar3;
        *(byte *)&ppVar1->update = (byte)ppVar1->update | 2;
        run_step(L'\0');
        return;
      }
      fmt = "No known path to downstairs.";
    }
    else {
      fmt = "Something is here.";
    }
  }
  else {
    fmt = "You cannot explore while confused.";
  }
  msg(fmt);
  return;
}

Assistant:

void do_cmd_navigate_down(struct command *cmd)
{
	int visible_monster_count = 0;

	/* cancel if confused */
	if (player->timed[TMD_CONFUSED]) {
		msg("You cannot explore while confused.");
	   	return;
	}


	/* If we're in a web, deal with that */
	if (square_iswebbed(cave, player->grid)) {
		/* Clear the web, finish turn */
		msg("You clear the web.");
		square_destroy_trap(cave, player->grid);
		player->upkeep->energy_use = z_info->move_energy;
		return;
	}
	

	/* Screen for visible monsters */
	for (int y = 0; y < cave->height; y++) {
		for (int x = 0; x < cave->width; x++) {
			struct loc grid = loc(x, y);
			
			if (loc_eq(grid, player->grid)) continue;

			if (square_isoccupied(cave, grid)) {
				int m_idx = square(cave, grid)->mon;
				struct monster *mon = cave_monster(cave, m_idx);
				if (monster_is_obvious(mon)) {
					visible_monster_count++;
					break;
				}
			}
		}
	}

	if (visible_monster_count > 0) {
		msg("Something is here.");
		return;
	}

	assert(!player->upkeep->steps);
	player->upkeep->step_count = path_nearest_known(player, player->grid,
		square_isdownstairs, &player->upkeep->path_dest,
		&player->upkeep->steps);
	if (player->upkeep->step_count > 0) {
		player->upkeep->running = player->upkeep->step_count;
		/* Calculate torch radius */
		player->upkeep->update |= (PU_TORCH);
		run_step(0);
		return;
	}

	msg("No known path to downstairs.");
}